

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

word Dau_Dsd6TruthCompose_rec(word Func,word *pFanins,int nVars)

{
  ulong uVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  ulong uVar5;
  
  if (1 < Func + 1) {
    uVar1 = (ulong)(nVars - 1);
    do {
      uVar5 = uVar1;
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x155,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
      }
      if ((int)uVar5 == 0) {
        if (Func == 0x5555555555555555 || s_Truths6[0] == Func) {
          return -(ulong)(s_Truths6[0] != Func) ^ *pFanins;
        }
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x158,"word Dau_Dsd6TruthCompose_rec(word, word *, int)");
      }
      iVar2 = Abc_Tt6HasVar(Func,(int)uVar5);
      nVars = nVars + -1;
      uVar1 = uVar5 - 1;
    } while (iVar2 == 0);
    wVar3 = Abc_Tt6Cofactor0(Func,nVars);
    wVar3 = Dau_Dsd6TruthCompose_rec(wVar3,pFanins,nVars);
    wVar4 = Abc_Tt6Cofactor1(Func,nVars);
    wVar4 = Dau_Dsd6TruthCompose_rec(wVar4,pFanins,nVars);
    Func = (wVar4 ^ wVar3) & pFanins[uVar5] ^ wVar3;
  }
  return Func;
}

Assistant:

word Dau_Dsd6TruthCompose_rec( word Func, word * pFanins, int nVars )
{
    word t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return ~(word)0;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return (Func == s_Truths6[0]) ? pFanins[0] : ~pFanins[0];
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_Dsd6TruthCompose_rec( Func, pFanins, nVars );
    t0 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_Dsd6TruthCompose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    return (~pFanins[nVars] & t0) | (pFanins[nVars] & t1);
}